

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O2

btSoftBody *
btSoftBodyHelpers::CreateFromConvexHull
          (btSoftBodyWorldInfo *worldInfo,btVector3 *vertices,int nvertices,
          bool randomizeConstraints)

{
  int node0;
  int node1;
  int node1_00;
  btSoftBody *this;
  int i;
  long lVar1;
  long lVar2;
  HullResult hres;
  HullLibrary hlib;
  HullDesc local_50;
  
  local_50.mFlags = 1;
  hres.m_OutputVertices.m_ownsMemory = true;
  hres.m_OutputVertices.m_data = (btVector3 *)0x0;
  hres.m_OutputVertices.m_size = 0;
  hres.m_OutputVertices.m_capacity = 0;
  hres.m_Indices.m_ownsMemory = true;
  hres.m_Indices.m_data = (uint *)0x0;
  hres.m_Indices.m_size = 0;
  hres.m_Indices.m_capacity = 0;
  hres.mPolygons = true;
  hres.mNumOutputVertices = 0;
  hres.mNumFaces = 0;
  hres.mNumIndices = 0;
  hlib.m_tris.m_ownsMemory = true;
  hlib.m_tris.m_data = (btHullTriangle **)0x0;
  local_50.mVertexStride = 0x10;
  local_50.mNormalEpsilon = 0.001;
  hlib.m_tris.m_size = 0;
  hlib.m_tris.m_capacity = 0;
  hlib.m_vertexIndexMapping.m_ownsMemory = true;
  hlib.m_vertexIndexMapping.m_data = (int *)0x0;
  hlib.m_vertexIndexMapping.m_size = 0;
  hlib.m_vertexIndexMapping.m_capacity = 0;
  local_50.mVcount = nvertices;
  local_50.mVertices = vertices;
  local_50.mMaxVertices = nvertices;
  HullLibrary::CreateConvexHull(&hlib,&local_50,&hres);
  this = (btSoftBody *)btCollisionObject::operator_new(0x690);
  btSoftBody::btSoftBody
            (this,worldInfo,hres.mNumOutputVertices,hres.m_OutputVertices.m_data,(btScalar *)0x0);
  lVar2 = 8;
  for (lVar1 = 0; lVar1 < (int)hres.mNumFaces; lVar1 = lVar1 + 1) {
    node0 = *(int *)((long)hres.m_Indices.m_data + lVar2 + -8);
    node1 = *(int *)((long)hres.m_Indices.m_data + lVar2 + -4);
    node1_00 = *(int *)((long)hres.m_Indices.m_data + lVar2);
    if (node0 < node1) {
      btSoftBody::appendLink(this,node0,node1,(Material *)0x0,false);
    }
    if (node1 < node1_00) {
      btSoftBody::appendLink(this,node1,node1_00,(Material *)0x0,false);
    }
    if (node1_00 < node0) {
      btSoftBody::appendLink(this,node1_00,node0,(Material *)0x0,false);
    }
    btSoftBody::appendFace(this,node0,node1,node1_00,(Material *)0x0);
    lVar2 = lVar2 + 0xc;
  }
  HullLibrary::ReleaseResult(&hlib,&hres);
  if (randomizeConstraints) {
    btSoftBody::randomizeConstraints(this);
  }
  HullLibrary::~HullLibrary(&hlib);
  HullResult::~HullResult(&hres);
  return this;
}

Assistant:

btSoftBody*		btSoftBodyHelpers::CreateFromConvexHull(btSoftBodyWorldInfo& worldInfo,	const btVector3* vertices,
														int nvertices, bool randomizeConstraints)
{
	HullDesc		hdsc(QF_TRIANGLES,nvertices,vertices);
	HullResult		hres;
	HullLibrary		hlib;/*??*/ 
	hdsc.mMaxVertices=nvertices;
	hlib.CreateConvexHull(hdsc,hres);
	btSoftBody*		psb=new btSoftBody(&worldInfo,(int)hres.mNumOutputVertices,
		&hres.m_OutputVertices[0],0);
	for(int i=0;i<(int)hres.mNumFaces;++i)
	{
		const int idx[]={	static_cast<int>(hres.m_Indices[i*3+0]),
							static_cast<int>(hres.m_Indices[i*3+1]),
							static_cast<int>(hres.m_Indices[i*3+2])};
		if(idx[0]<idx[1]) psb->appendLink(	idx[0],idx[1]);
		if(idx[1]<idx[2]) psb->appendLink(	idx[1],idx[2]);
		if(idx[2]<idx[0]) psb->appendLink(	idx[2],idx[0]);
		psb->appendFace(idx[0],idx[1],idx[2]);
	}
	hlib.ReleaseResult(hres);
	if (randomizeConstraints)
	{
		psb->randomizeConstraints();
	}
	return(psb);
}